

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

void __thiscall
Fl_Text_Buffer::call_modify_callbacks
          (Fl_Text_Buffer *this,int pos,int nDeleted,int nInserted,int nRestyled,char *deletedText)

{
  int local_2c;
  int i;
  char *deletedText_local;
  int nRestyled_local;
  int nInserted_local;
  int nDeleted_local;
  int pos_local;
  Fl_Text_Buffer *this_local;
  
  for (local_2c = 0; local_2c < this->mNModifyProcs; local_2c = local_2c + 1) {
    (*this->mModifyProcs[local_2c])
              (pos,nInserted,nDeleted,nRestyled,deletedText,this->mCbArgs[local_2c]);
  }
  return;
}

Assistant:

void Fl_Text_Buffer::call_modify_callbacks(int pos, int nDeleted,
					   int nInserted, int nRestyled,
					   const char *deletedText) const {
  IS_UTF8_ALIGNED2(this, pos)
  for (int i = 0; i < mNModifyProcs; i++)
    (*mModifyProcs[i]) (pos, nInserted, nDeleted, nRestyled,
			deletedText, mCbArgs[i]);
}